

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CodeSinkingPass::SinkInstructionsInBB(CodeSinkingPass *this,BasicBlock *bb)

{
  Instruction *pIVar1;
  bool bVar2;
  Instruction *pIVar3;
  bool bVar4;
  Instruction *pIVar5;
  
  bVar4 = false;
  pIVar1 = &(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar5 = pIVar1;
  while (pIVar5 != (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_) {
    bVar2 = SinkInstruction(this,(pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                 previous_node_);
    pIVar3 = pIVar1;
    if (!bVar2) {
      pIVar3 = pIVar5;
    }
    bVar4 = (bool)(bVar4 | bVar2);
    pIVar5 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
  }
  return bVar4;
}

Assistant:

bool CodeSinkingPass::SinkInstructionsInBB(BasicBlock* bb) {
  bool modified = false;
  for (auto inst = bb->rbegin(); inst != bb->rend(); ++inst) {
    if (SinkInstruction(&*inst)) {
      inst = bb->rbegin();
      modified = true;
    }
  }
  return modified;
}